

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O1

CTcSrcFile *
CTcSrcFile::open_source
          (char *filename,CResLoader *res_loader,char *default_charset,int *charset_error,
          int *default_charset_error)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  FILE *__stream;
  long __off;
  size_t sVar6;
  CTcSrcFile *pCVar7;
  CCharmapToUni *pCVar8;
  CVmDataSource *pCVar9;
  char *pcVar10;
  char *pcVar11;
  uint big_endian;
  ulong uVar12;
  long lVar13;
  char **ppcVar14;
  char *pcVar15;
  ulong uVar16;
  bool bVar17;
  char buf [275];
  ulong local_170;
  char local_148;
  char cStack_147;
  char cStack_146;
  undefined5 uStack_145;
  char cStack_140;
  undefined2 uStack_13f;
  char local_13d;
  
  *charset_error = 0;
  *default_charset_error = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return (CTcSrcFile *)0x0;
  }
  __off = ftell(__stream);
  pCVar7 = (CTcSrcFile *)&stack0xfffffffffffffeb8;
  sVar6 = fread(pCVar7,1,0x113,__stream);
  cVar4 = cStack_147;
  cVar1 = local_148;
  if ((((2 < sVar6) && (local_148 == -0x11)) && (cStack_147 == -0x45)) && (cStack_146 == -0x41)) {
    pcVar15 = (char *)0x3;
    if ((sVar6 - 0xd < 0xfffffffffffffff6) &&
       (local_13d == ' ' &&
        CONCAT26(uStack_13f,CONCAT15(cStack_140,uStack_145)) == 0x7465737261686323)) {
      pcVar10 = &stack0xfffffffffffffec4;
      uVar12 = sVar6 - 0xc;
      if (uVar12 != 0) {
        do {
          if ((*pcVar10 != ' ') && (*pcVar10 != '\t')) goto LAB_00242279;
          pcVar10 = pcVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        uVar12 = 0;
        pcVar10 = &stack0xfffffffffffffeb8 + sVar6;
      }
LAB_00242279:
      if ((uVar12 < 7) || (iVar5 = memicmp(pcVar10,"\"utf-8\"",7), iVar5 != 0)) {
        if ((5 < uVar12) && (iVar5 = memicmp(pcVar10,"\"utf8\"",6), iVar5 == 0)) {
          pcVar15 = pcVar10 + (6 - (long)pCVar7);
        }
      }
      else {
        pcVar15 = pcVar10 + (7 - (long)pCVar7);
      }
    }
    fseek(__stream,((ulong)pcVar15 & 0xffffffff) + __off,0);
    pCVar7 = (CTcSrcFile *)operator_new(0x430);
    pCVar8 = (CCharmapToUni *)operator_new(0x10);
    (pCVar8->super_CCharmap)._vptr_CCharmap = (_func_int **)0x0;
    *(undefined8 *)&(pCVar8->super_CCharmap).ref_cnt_ = 0;
    (pCVar8->super_CCharmap).ref_cnt_ = 1;
    (pCVar8->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_003547c8;
    (pCVar7->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0035eff0;
    pCVar9 = (CVmDataSource *)operator_new(0x10);
    pCVar7->fp_ = pCVar9;
    pCVar7->field_0x8 = pCVar7->field_0x8 & 0xfe;
    pCVar9->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
    pCVar9[1]._vptr_CVmDataSource = (_func_int **)__stream;
    goto LAB_00242463;
  }
  if (1 < sVar6) {
    if (cStack_147 == -2 && local_148 == -1) {
      pCVar7 = (CTcSrcFile *)operator_new(0x430);
      pCVar8 = (CCharmapToUni *)operator_new(0x210);
      memset(pCVar8,0,0x210);
      (pCVar8->super_CCharmap).ref_cnt_ = 1;
      (pCVar8->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_00354830;
      (pCVar7->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0035eff0;
      pCVar9 = (CVmDataSource *)operator_new(0x10);
      pCVar7->fp_ = pCVar9;
      pCVar7->field_0x8 = pCVar7->field_0x8 & 0xfe;
      pCVar9->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
      pCVar9[1]._vptr_CVmDataSource = (_func_int **)__stream;
      pCVar7->rem_ = 0;
      pCVar7->mapper_ = pCVar8;
    }
    else {
      pCVar7 = (CTcSrcFile *)0x0;
    }
    bVar17 = cVar4 == -1 && cVar1 == -2;
    bVar2 = cVar4 != -1;
    bVar3 = cVar1 != -2;
    if (bVar17) {
      pCVar7 = (CTcSrcFile *)operator_new(0x430);
      pCVar8 = (CCharmapToUni *)operator_new(0x210);
      memset(pCVar8,0,0x210);
      (pCVar8->super_CCharmap).ref_cnt_ = 1;
      (pCVar8->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_00354900;
      (pCVar7->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0035eff0;
      pCVar9 = (CVmDataSource *)operator_new(0x10);
      pCVar9->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
      pCVar9[1]._vptr_CVmDataSource = (_func_int **)__stream;
      pCVar7->fp_ = pCVar9;
      pCVar7->field_0x8 = pCVar7->field_0x8 & 0xfe;
      pCVar7->rem_ = 0;
      pCVar7->mapper_ = pCVar8;
      ppcVar14 = open_source(char_const*,CResLoader*,char_const*,int*,int*)::names;
    }
    else {
      ppcVar14 = open_source::names;
    }
    big_endian = (uint)bVar17;
    if (pCVar7 != (CTcSrcFile *)0x0) {
      iVar5 = ucs_str_starts_with(&stack0xfffffffffffffeba,sVar6 - 2,"#charset ",big_endian,0);
      local_170 = 2;
      if (1 < sVar6 - 0x14 && iVar5 != 0) {
        pcVar15 = &stack0xfffffffffffffece;
        uVar16 = (ulong)(bVar2 || bVar3);
        uVar12 = sVar6 - 0x16;
        do {
          cVar1 = pcVar15[~uVar16];
          if ((cVar1 != ' ' && cVar1 != '\t') ||
             (0x7f < CONCAT11(pcVar15[uVar16 | 0xfffffffffffffffe],cVar1))) {
            if ((cVar1 == '\"') &&
               ((CONCAT11(pcVar15[uVar16 | 0xfffffffffffffffe],cVar1) < 0x80 &&
                (pcVar10 = *ppcVar14, pcVar10 != (char *)0x0)))) {
              local_170 = 2;
              goto LAB_002422f8;
            }
            break;
          }
          pcVar15 = pcVar15 + 2;
          bVar17 = 1 < uVar12;
          uVar12 = uVar12 - 2;
        } while (bVar17);
      }
      goto LAB_00242393;
    }
  }
  if ((8 < sVar6) &&
     (cStack_140 == ' ' &&
      CONCAT53(uStack_145,CONCAT12(cStack_146,CONCAT11(cStack_147,local_148))) == 0x7465737261686323
     )) {
    bVar2 = true;
    if (sVar6 != 9) {
      lVar13 = 0;
      do {
        cVar1 = *(char *)((long)&stack0xfffffffffffffec1 + lVar13);
        if ((cVar1 != '\t') && (cVar1 != ' ')) {
          if ((cVar1 == '\"') && (sVar6 - 10 != lVar13)) {
            pcVar15 = (undefined1 *)((long)register0x00000020 + -0x13e) + lVar13;
            goto LAB_002424b4;
          }
          break;
        }
        lVar13 = lVar13 + 1;
      } while (sVar6 - 9 != lVar13);
    }
    goto LAB_002423bb;
  }
  goto LAB_002423c7;
LAB_002422f8:
  do {
    ppcVar14 = ppcVar14 + 1;
    iVar5 = ucs_str_starts_with(pcVar15,uVar12,pcVar10,big_endian,1);
    if (iVar5 != 0) {
      sVar6 = strlen(pcVar10);
      uVar16 = sVar6 * 2 + 2;
      bVar17 = true;
      if (uVar16 <= uVar12) {
        pcVar10 = pcVar15 + sVar6 * 2;
        pcVar11 = pcVar15 + sVar6 * 2 + 1;
        if (!bVar2 && !bVar3) {
          pcVar11 = pcVar10;
          pcVar10 = pcVar15 + sVar6 * 2 + 1;
        }
        if ((*pcVar10 == '\"') && (CONCAT11(*pcVar11,0x22) < 0x80)) {
          pcVar15 = pcVar15 + uVar16;
          local_170 = (ulong)(uint)((int)pcVar15 - (int)&stack0xfffffffffffffeb8);
          bVar17 = false;
          uVar12 = uVar12 - uVar16;
        }
      }
      if (!bVar17) break;
    }
    pcVar10 = *ppcVar14;
  } while (pcVar10 != (char *)0x0);
LAB_00242393:
  fseek(__stream,local_170 + __off,0);
  return pCVar7;
  while (lVar13 = lVar13 + 1, sVar6 - 10 != lVar13) {
LAB_002424b4:
    cVar1 = ((undefined1 *)((long)register0x00000020 + -0x13e))[lVar13];
    if ((cVar1 == '\n') || (cVar1 == '\r')) break;
    if (cVar1 == '\"') {
      fseek(__stream,__off + lVar13 + 0xb,0);
      ((undefined1 *)((long)register0x00000020 + -0x13e))[lVar13] = 0;
      pCVar8 = CCharmapToUni::load(res_loader,pcVar15);
      if (pCVar8 == (CCharmapToUni *)0x0) {
        *charset_error = 1;
      }
      else {
        pCVar7 = (CTcSrcFile *)operator_new(0x430);
        (pCVar7->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0035eff0;
        pCVar9 = (CVmDataSource *)operator_new(0x10);
        pCVar9->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
        pCVar7->fp_ = pCVar9;
        pCVar7->field_0x8 = pCVar7->field_0x8 & 0xfe;
        pCVar9[1]._vptr_CVmDataSource = (_func_int **)__stream;
        pCVar7->rem_ = 0;
        pCVar7->mapper_ = pCVar8;
        bVar2 = false;
      }
      break;
    }
  }
LAB_002423bb:
  if (!bVar2) {
    return pCVar7;
  }
LAB_002423c7:
  fseek(__stream,__off,0);
  if (default_charset == (char *)0x0) {
    pCVar8 = (CCharmapToUni *)operator_new(0x210);
    memset(pCVar8,0,0x210);
    (pCVar8->super_CCharmap).ref_cnt_ = 1;
    (pCVar8->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_00354968;
  }
  else {
    pCVar8 = CCharmapToUni::load(res_loader,default_charset);
  }
  if (pCVar8 == (CCharmapToUni *)0x0) {
    *default_charset_error = 1;
    fclose(__stream);
    return (CTcSrcFile *)0x0;
  }
  pCVar7 = (CTcSrcFile *)operator_new(0x430);
  (pCVar7->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0035eff0;
  pCVar9 = (CVmDataSource *)operator_new(0x10);
  pCVar7->fp_ = pCVar9;
  pCVar7->field_0x8 = pCVar7->field_0x8 & 0xfe;
  pCVar9->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_00352db0;
  pCVar9[1]._vptr_CVmDataSource = (_func_int **)__stream;
LAB_00242463:
  pCVar7->rem_ = 0;
  pCVar7->mapper_ = pCVar8;
  return pCVar7;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_source(const char *filename,
                                    class CResLoader *res_loader,
                                    const char *default_charset,
                                    int *charset_error,
                                    int *default_charset_error)
{
    char buf[275];
    size_t siz;
    osfildef *fp;
    long startofs;
    CCharmapToUni *mapper;

    /* presume we won't find an invalid #charset directive */
    *charset_error = FALSE;

    /* presume we'll have no problem with the default character set */
    *default_charset_error = FALSE;

    /* 
     *   open the file in binary mode, so that we can scan the first few
     *   bytes to see if we can detect the character set from information
     *   at the beginning of the file 
     */
    fp = osfoprb(filename, OSFTTEXT);

    /* if we couldn't open the file, return failure */
    if (fp == 0)
        return 0;

    /* note the starting offset in the file */
    startofs = osfpos(fp);

    /* read the first few bytes of the file */
    siz = osfrbc(fp, buf, sizeof(buf));

    /* check for a 3-byte UTF-8 byte-order marker */
    if (siz >= 3  && (uchar)buf[0] == 0xEF && (uchar)buf[1] == 0xBB
        && (uchar)buf[2] == 0xBF)
    {
        char *p;
        size_t rem;
        uint skip;

        /* skip at least the three-byte marker sequence */
        skip = 3;
        
        /* 
         *   check for a #charset marker for utf-8 - this would be redundant,
         *   but we'll allow it 
         */
        p = buf + 3;
        rem = siz - 3;
        if (rem > 9 && memcmp(p, "#charset ", 9) == 0)
        {
            /* skip spaces */
            for (p += 9, rem -= 9 ; rem != 0 && (*p == ' ' || *p == '\t') ;
                 ++p, --rem);

            /* check for valid character set markers */
            if (rem >= 7 && memicmp(p, "\"utf-8\"", 7) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 7) - buf;
            }
            else if (rem >= 6 && memicmp(p, "\"utf8\"", 6) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 6) - buf;
            }
        }

        /* seek past the character set markers */
        osfseek(fp, startofs + skip, OSFSK_SET);

        /* return a new utf-8 decoder */
        return new CTcSrcFile(fp, new CCharmapToUniUTF8());
    }

    /* if we read at least two bytes, try auto-detecting unicode */
    if (siz >= 2)
    {
        CTcSrcFile *srcf;
        const char *const *cs_names;
        int bige;

        /* presume we won't find a byte-order marker */
        srcf = 0;
        
        /* if the first bytes are 0xFF 0xFE, it's UCS-2 low-byte first */
        if ((unsigned char)buf[0] == 0xFF && (unsigned char)buf[1] == 0xFE)
        {
            static const char *names[] = { "unicodel", "utf-16le", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Little());
            bige = FALSE;
            cs_names = names;
        }

        /* if the first bytes are 0xFE 0xFF, it's UCS-2 high-byte first */
        if ((unsigned char)buf[0] == 0xFE && (unsigned char)buf[1] == 0xFF)
        {
            static const char *names[] = { "unicodeb", "utf-16be", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Big());
            bige = TRUE;
            cs_names = names;
        }

        /* if we found the byte-order marker, we know the character set */
        if (srcf != 0)
        {
            uint skip;

            /* we at least want to skip the byte-order marker */
            skip = 2;
            
            /* check to see if we have a '#charset' directive */
            if (ucs_str_starts_with(buf + 2, siz - 2, "#charset ",
                                    bige, FALSE))
            {
                char *p;
                size_t rem;
                
                /* scan past following spaces */
                for (p = buf + 2 + 18, rem = siz - 2 - 18 ;
                     rem >= 2 && (ucs_char_eq(p, ' ', bige, FALSE)
                                  || ucs_char_eq(p, '\t', bige, FALSE)) ;
                     p += 2, rem -= 2) ;

                /* check for a '"' */
                if (rem >= 2 && ucs_char_eq(p, '"', bige, FALSE))
                {
                    const char *const *n;

                    /* skip the '"' */
                    p += 2;
                    rem -= 2;
                    
                    /* 
                     *   check for a match to any of the valid names for this
                     *   character set 
                     */
                    for (n = cs_names ; *n != 0 ; ++n)
                    {
                        /* if it's a match, stop scanning */
                        if (ucs_str_starts_with(p, rem, *n, bige, TRUE))
                        {
                            size_t l;

                            /* get the length of the name */
                            l = strlen(*n) * 2;

                            /* check for a close quote */
                            if (rem >= l + 2
                                && ucs_char_eq(p + l, '"', bige, FALSE))
                            {
                                /* skip the name and the quote */
                                p += l + 2;
                                rem -= l + 2;

                                /* skip the source text to this point */
                                skip = p - buf;

                                /* stop scanning */
                                break;
                            }
                        }
                    }
                }
            }

            /* seek just past the character set indicators */
            osfseek(fp, startofs + skip, OSFSK_SET);

            /* return the file */
            return srcf;
        }
    }

    /*
     *   It doesn't appear to use UCS-2 encoding (at least, the file
     *   doesn't start with a byte-order sensing sequence).  Check to see
     *   if the file starts with "#charset " in ASCII single-byte
     *   characters.  
     */
    if (siz >= 9 && memcmp(buf, "#charset ", 9) == 0)
    {
        char *p;
        size_t rem;
        
        /* skip the #charset string and any following spaces */
        for (p = buf + 9, rem = siz - 9 ;
             rem > 0 && (*p == ' ' || *p == '\t') ; ++p, --rem) ;

        /* make sure we're looking at a '"' */
        if (rem != 0 && *p == '"')
        {
            char *charset_name;

            /* skip the open quote */
            ++p;
            --rem;
            
            /* remember where the character set name starts */
            charset_name = p;

            /* 
             *   find the closing quote, which must occur before a CR or
             *   LF character 
             */
            for ( ; rem > 0 && *p != '"' && *p != 10 && *p != 13 ;
                 ++p, --rem) ;

            /* make sure we found a matching quote */
            if (rem != 0 && *p == '"')
            {
                /* seek just past the #charset string */
                osfseek(fp, startofs + (p - buf) + 1, OSFSK_SET);

                /* 
                 *   put a null terminator at the end of the character set
                 *   name 
                 */
                *p = '\0';

                /* create a mapper */
                mapper = CCharmapToUni::load(res_loader, charset_name);

                /* 
                 *   if that succeeded, return a reader for the mapper;
                 *   otherwise, simply proceed as though no #charset had
                 *   been present, so that we create a default mapper 
                 */
                if (mapper != 0)
                {
                    /* success - return a reader */
                    return new CTcSrcFile(fp, mapper);
                }
                else
                {
                    /* tell the caller the #charset was invalid */
                    *charset_error = TRUE;
                }
            }
        }
    }

    /* 
     *   we didn't find any sensing codes, so seek back to the start of
     *   the file 
     */
    osfseek(fp, startofs, OSFSK_SET);

    /*
     *   We couldn't identify the file's character set based on anything
     *   in the file, so create a mapper for the given default character
     *   set.  If there's not even a default character set defined, create
     *   a plain ASCII mapper.  
     */
    if (default_charset != 0)
        mapper = CCharmapToUni::load(res_loader, default_charset);
    else
        mapper = new CCharmapToUniASCII();

    /* check to see if we created a mapper */
    if (mapper != 0)
    {
        /* return a source file reader based on the mapper */
        return new CTcSrcFile(fp, mapper);
    }
    else
    {
        /* 
         *   we failed to create a mapper for the default character set -
         *   flag the problem 
         */
        *default_charset_error = TRUE;

        /* close the input file */
        osfcls(fp);

        /* return failure */
        return 0;
    }
}